

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

cram_block_compression_hdr * cram_new_compression_header(void)

{
  cram_block_compression_hdr *__ptr;
  cram_block *b;
  kh_m_s2i_t *h;
  string_alloc_t *psVar1;
  
  __ptr = (cram_block_compression_hdr *)calloc(1,0x418);
  if (__ptr != (cram_block_compression_hdr *)0x0) {
    b = cram_new_block(CORE,0);
    __ptr->TD_blk = b;
    if (b != (cram_block *)0x0) {
      h = kh_init_m_s2i();
      __ptr->TD_hash = h;
      if (h != (kh_m_s2i_t *)0x0) {
        psVar1 = string_pool_create(0x2000);
        __ptr->TD_keys = psVar1;
        if (psVar1 != (string_alloc_t *)0x0) {
          return __ptr;
        }
        kh_destroy_m_s2i(h);
      }
      cram_free_block(b);
    }
    free(__ptr);
  }
  return (cram_block_compression_hdr *)0x0;
}

Assistant:

cram_block_compression_hdr *cram_new_compression_header(void) {
    cram_block_compression_hdr *hdr = calloc(1, sizeof(*hdr));
    if (!hdr)
	return NULL;

    if (!(hdr->TD_blk = cram_new_block(CORE, 0))) {
	free(hdr);
	return NULL;
    }

    if (!(hdr->TD_hash = kh_init(m_s2i))) {
	cram_free_block(hdr->TD_blk);
	free(hdr);
	return NULL;
    }

    if (!(hdr->TD_keys = string_pool_create(8192))) {
	kh_destroy(m_s2i, hdr->TD_hash);
	cram_free_block(hdr->TD_blk);
	free(hdr);
	return NULL;
    }

    return hdr;
}